

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_paged_audio_buffer_data_uninit
               (ma_paged_audio_buffer_data *pData,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_paged_audio_buffer_page *pmVar1;
  ma_paged_audio_buffer_page *__ptr;
  
  if (pData != (ma_paged_audio_buffer_data *)0x0) {
    pmVar1 = (pData->head).pNext;
    while (__ptr = pmVar1, __ptr != (ma_paged_audio_buffer_page *)0x0) {
      pmVar1 = __ptr->pNext;
      if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
        free(__ptr);
      }
      else if (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0) {
        (*pAllocationCallbacks->onFree)(__ptr,pAllocationCallbacks->pUserData);
      }
    }
  }
  return;
}

Assistant:

MA_API void ma_paged_audio_buffer_data_uninit(ma_paged_audio_buffer_data* pData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_paged_audio_buffer_page* pPage;

    if (pData == NULL) {
        return;
    }

    /* All pages need to be freed. */
    pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pData->head.pNext);
    while (pPage != NULL) {
        ma_paged_audio_buffer_page* pNext = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPage->pNext);

        ma_free(pPage, pAllocationCallbacks);
        pPage = pNext;
    }
}